

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall UTF32Test_decode_codepoint_Test::TestBody(UTF32Test_decode_codepoint_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  char32_t local_30 [2];
  char32_t local_28;
  undefined4 uStack_24;
  unsigned_long local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_28 = L'\0';
  local_20 = 0;
  local_30[0] = L'\0';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\"sv ).codepoint","U\'\\0\'",&local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x75,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\0';
  local_20 = 0;
  local_30[0] = L'\0';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\"sv ).units","0U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x75,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\0';
  local_20 = 1;
  local_30[0] = L'\0';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\0\"sv ).codepoint","U\'\\0\'",&local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x76,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\0';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\0\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x76,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'A';
  local_20 = 1;
  local_30[0] = L'A';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"A\"sv ).codepoint","U\'A\'",&local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x77,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'A';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"A\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x77,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'z';
  local_20 = 1;
  local_30[0] = L'z';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"z\"sv ).codepoint","U\'z\'",&local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x78,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'z';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"z\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x78,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\x7f';
  local_20 = 1;
  local_30[0] = L'\x7f';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\u007F\"sv ).codepoint","U\'\\u007F\'",&local_28,
             local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x79,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\x7f';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\u007F\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x79,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\x80';
  local_20 = 1;
  local_30[0] = L'\x80';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\u0080\"sv ).codepoint","U\'\\u0080\'",&local_28,
             local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\x80';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\u0080\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'߿';
  local_20 = 1;
  local_30[0] = L'߿';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\u07FF\"sv ).codepoint","U\'\\u07FF\'",&local_28,
             local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'߿';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\u07FF\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'ࠀ';
  local_20 = 1;
  local_30[0] = L'ࠀ';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\u0800\"sv ).codepoint","U\'\\u0800\'",&local_28,
             local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'ࠀ';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\u0800\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\xffff';
  local_20 = 1;
  local_30[0] = L'\xffff';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\uFFFF\"sv ).codepoint","U\'\\uFFFF\'",&local_28,
             local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\xffff';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\uFFFF\"sv ).units","1U",&local_20,(uint *)local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'𐀀';
  local_20 = 1;
  local_30[0] = L'𐀀';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\U00010000\"sv ).codepoint","U\'\\U00010000\'",
             &local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'𐀀';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\U00010000\"sv ).units","1U",&local_20,(uint *)local_30
            );
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\x0010ffff';
  local_20 = 1;
  local_30[0] = L'\x0010ffff';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\U0010FFFF\"sv ).codepoint","U\'\\U0010FFFF\'",
             &local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'\x0010ffff';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\U0010FFFF\"sv ).units","1U",&local_20,(uint *)local_30
            );
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'😄';
  local_20 = 1;
  local_30[0] = L'😄';
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_18,"decode_codepoint( U\"\\U0001F604\"sv ).codepoint","U\'\\U0001F604\'",
             &local_28,local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = L'😄';
  local_20 = 1;
  local_30[0] = L'\x01';
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            (local_18,"decode_codepoint( U\"\\U0001F604\"sv ).units","1U",&local_20,(uint *)local_30
            );
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if ((long *)CONCAT44(uStack_24,local_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST(UTF32Test, decode_codepoint) {
	DECODE_CODEPOINT_TEST(U""sv, U'\0', 0U);
	DECODE_CODEPOINT_TEST(U"\0"sv, U'\0', 1U);
	DECODE_CODEPOINT_TEST(U"A"sv, U'A', 1U);
	DECODE_CODEPOINT_TEST(U"z"sv, U'z', 1U);
	DECODE_CODEPOINT_TEST(U"\u007F"sv, U'\u007F', 1U);
	DECODE_CODEPOINT_TEST(U"\u0080"sv, U'\u0080', 1U);
	DECODE_CODEPOINT_TEST(U"\u07FF"sv, U'\u07FF', 1U);
	DECODE_CODEPOINT_TEST(U"\u0800"sv, U'\u0800', 1U);
	DECODE_CODEPOINT_TEST(U"\uFFFF"sv, U'\uFFFF', 1U);
	DECODE_CODEPOINT_TEST(U"\U00010000"sv, U'\U00010000', 1U);
	DECODE_CODEPOINT_TEST(U"\U0010FFFF"sv, U'\U0010FFFF', 1U);
	DECODE_CODEPOINT_TEST(U"\U0001F604"sv, U'\U0001F604', 1U);
}